

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall
Assimp::FBXExporter::WriteModelNodes
          (FBXExporter *this,StreamWriterLE *outstream,aiNode *node,int64_t parent_uid,
          unordered_set<const_aiNode_*,_std::hash<const_aiNode_*>,_std::equal_to<const_aiNode_*>,_std::allocator<const_aiNode_*>_>
          *limbnodes,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
          *transform_chain)

{
  vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_> *pvVar1;
  undefined1 uVar2;
  bool bVar3;
  aiNode *paVar4;
  FBXExporter *pFVar5;
  int64_t iVar6;
  StreamWriterLE *pSVar7;
  long lVar8;
  const_iterator cVar9;
  DeadlyImportError *pDVar10;
  iterator iVar11;
  mapped_type_conflict2 *pmVar12;
  size_type sVar13;
  ostream *poVar14;
  uint uVar15;
  uint i;
  ulong uVar16;
  FBXExporter *pFVar17;
  aiVector3t<float> *__args_1;
  aiNode *node_local;
  allocator<char> local_329;
  FBXExporter *local_328;
  int64_t node_uid;
  float local_318;
  StreamWriterLE *local_310;
  _Hashtable<const_aiNode_*,_const_aiNode_*,_std::allocator<const_aiNode_*>,_std::__detail::_Identity,_std::equal_to<const_aiNode_*>,_std::hash<const_aiNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_308;
  int64_t node_attribute_uid;
  int64_t new_node_uid;
  float local_2d8;
  int64_t parent_uid_local;
  undefined1 local_2c8 [32];
  string type_name;
  string node_name;
  FBXExportProperty local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  stringstream err;
  ostream local_1c8 [40];
  vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_> local_1a0 [14];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  node_local = node;
  local_308 = &limbnodes->_M_h;
  parent_uid_local = parent_uid;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&node_name,(node->mName).data,(allocator<char> *)&err);
  lVar8 = std::__cxx11::string::find((string *)&node_name,0x8306e0);
  local_328 = this;
  local_310 = outstream;
  if (lVar8 == -1) {
    node_uid = 0;
    if (this->mScene->mRootNode != node) {
      iVar11 = std::
               _Rb_tree<const_aiNode_*,_std::pair<const_aiNode_*const,_long>,_std::_Select1st<std::pair<const_aiNode_*const,_long>_>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_long>_>_>
               ::find(&(this->node_uids)._M_t,&node_local);
      if ((_Rb_tree_header *)iVar11._M_node == &(this->node_uids)._M_t._M_impl.super__Rb_tree_header
         ) {
        lVar8 = this->last_uid + 1;
        this->last_uid = lVar8;
        node_uid = lVar8;
        pmVar12 = std::
                  map<const_aiNode_*,_long,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_long>_>_>
                  ::operator[](&this->node_uids,&node_local);
        *pmVar12 = lVar8;
      }
      else {
        node_uid = (int64_t)iVar11._M_node[1]._M_parent;
      }
      pFVar17 = local_328;
      pvVar1 = &local_328->connections;
      std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
      emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)pvVar1,
                 (char (*) [2])0x5c8419,(char (*) [3])"OO",&node_uid,&parent_uid_local);
      pFVar5 = local_328;
      if (node_local != pFVar17->mScene->mRootNode) {
        if (node_local->mNumMeshes == 1) {
          std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
          emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                    ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)pvVar1,
                     (char (*) [2])0x5c8419,(char (*) [3])"OO",
                     (local_328->mesh_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start + *node_local->mMeshes,&node_uid);
          std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
          emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                    ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)pvVar1,
                     (char (*) [2])0x5c8419,(char (*) [3])"OO",
                     (pFVar5->material_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl
                     .super__Vector_impl_data._M_start +
                     pFVar5->mScene->mMeshes[*node_local->mMeshes]->mMaterialIndex,&node_uid);
          iVar6 = node_uid;
          paVar4 = node_local;
          bVar3 = pFVar5->binary;
          pFVar17 = (FBXExporter *)&err;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pFVar17,"Mesh",(allocator<char> *)&type_name);
          WriteModelNode(pFVar17,outstream,bVar3,paVar4,iVar6,(string *)&err,transform_chain,
                         TransformInheritance_RSrs);
        }
        else {
          sVar13 = std::
                   _Hashtable<const_aiNode_*,_const_aiNode_*,_std::allocator<const_aiNode_*>,_std::__detail::_Identity,_std::equal_to<const_aiNode_*>,_std::hash<const_aiNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(local_308,&node_local);
          iVar6 = node_uid;
          paVar4 = node_local;
          bVar3 = local_328->binary;
          if (sVar13 != 0) {
            pFVar17 = (FBXExporter *)&err;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)pFVar17,"LimbNode",(allocator<char> *)&type_name);
            WriteModelNode(pFVar17,local_310,bVar3,paVar4,iVar6,(string *)&err,transform_chain,
                           TransformInheritance_RSrs);
            std::__cxx11::string::~string((string *)&err);
            node_attribute_uid = local_328->last_uid + 1;
            local_328->last_uid = node_attribute_uid;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&type_name,"NodeAttribute",(allocator<char> *)local_2c8);
            FBX::Node::Node((Node *)&err,&type_name);
            pSVar7 = local_310;
            std::__cxx11::string::~string((string *)&type_name);
            iVar6 = node_attribute_uid;
            std::operator+(&local_1f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           FBX::SEPARATOR_abi_cxx11_,"NodeAttribute");
            FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>
                      ((Node *)&err,iVar6,&local_1f8,"LimbNode");
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&type_name,"TypeFlags",(allocator<char> *)local_2c8);
            FBX::FBXExportProperty::FBXExportProperty(&local_218,"Skeleton",false);
            FBX::Node::AddChild<Assimp::FBX::FBXExportProperty>((Node *)&err,&type_name,&local_218);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_218.data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            std::__cxx11::string::~string((string *)&type_name);
            FBX::Node::Dump((Node *)&err,pSVar7,local_328->binary,1);
            std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
            emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                      ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)pvVar1,
                       (char (*) [2])0x5c8419,(char (*) [3])"OO",&node_attribute_uid,&node_uid);
            FBX::Node::~Node((Node *)&err);
            goto LAB_0034b39e;
          }
          pFVar17 = (FBXExporter *)&err;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pFVar17,"Null",(allocator<char> *)&type_name);
          WriteModelNode(pFVar17,local_310,bVar3,paVar4,iVar6,(string *)&err,transform_chain,
                         TransformInheritance_RSrs);
        }
        std::__cxx11::string::~string((string *)&err);
      }
    }
LAB_0034b39e:
    uVar15 = node_local->mNumMeshes;
    if ((1 < uVar15) || (node_local == local_328->mScene->mRootNode)) {
      pvVar1 = &local_328->connections;
      for (uVar16 = 0; pFVar17 = local_328, uVar16 < uVar15; uVar16 = uVar16 + 1) {
        new_node_uid = local_328->last_uid + 1;
        local_328->last_uid = new_node_uid;
        std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
        emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                  ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)pvVar1,
                   (char (*) [2])0x5c8419,(char (*) [3])"OO",&new_node_uid,&node_uid);
        std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
        emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                  ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)pvVar1,
                   (char (*) [2])0x5c8419,(char (*) [3])"OO",
                   (pFVar17->mesh_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + node_local->mMeshes[uVar16],&new_node_uid);
        std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
        emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                  ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)pvVar1,
                   (char (*) [2])0x5c8419,(char (*) [3])"OO",
                   (pFVar17->material_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   pFVar17->mScene->mMeshes[node_local->mMeshes[uVar16]]->mMaterialIndex,
                   &new_node_uid);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&type_name,"Model",(allocator<char> *)&node_attribute_uid);
        FBX::Node::Node((Node *)&err,&type_name);
        std::__cxx11::string::~string((string *)&type_name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&node_attribute_uid,
                   (local_328->mScene->mMeshes[node_local->mMeshes[uVar16]]->mName).data,
                   (allocator<char> *)&type_name);
        std::operator+(&type_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       FBX::SEPARATOR_abi_cxx11_,"Model");
        std::__cxx11::string::append((string *)&node_attribute_uid);
        std::__cxx11::string::~string((string *)&type_name);
        iVar6 = new_node_uid;
        std::__cxx11::string::string((string *)&local_50,(string *)&node_attribute_uid);
        FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>
                  ((Node *)&err,iVar6,&local_50,"Mesh");
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&type_name,"Version",(allocator<char> *)local_2c8);
        FBX::Node::AddChild<int>((Node *)&err,&type_name,0xe8);
        std::__cxx11::string::~string((string *)&type_name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2c8,"Properties70",&local_329);
        FBX::Node::Node((Node *)&type_name,(string *)local_2c8);
        std::__cxx11::string::~string((string *)local_2c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2c8,"InheritType",&local_329);
        FBX::Node::AddP70enum((Node *)&type_name,(string *)local_2c8,1);
        std::__cxx11::string::~string((string *)local_2c8);
        std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
                  (local_1a0,(Node *)&type_name);
        FBX::Node::Dump((Node *)&err,local_310,local_328->binary,1);
        FBX::Node::~Node((Node *)&type_name);
        std::__cxx11::string::~string((string *)&node_attribute_uid);
        FBX::Node::~Node((Node *)&err);
        uVar15 = node_local->mNumMeshes;
      }
    }
    pSVar7 = local_310;
    for (uVar16 = 0; uVar16 < node_local->mNumChildren; uVar16 = uVar16 + 1) {
      WriteModelNodes(local_328,pSVar7,node_local->mChildren[uVar16],node_uid,
                      (unordered_set<const_aiNode_*,_std::hash<const_aiNode_*>,_std::equal_to<const_aiNode_*>,_std::allocator<const_aiNode_*>_>
                       *)local_308);
    }
    goto LAB_0034b043;
  }
  std::__cxx11::string::find((string *)&node_name,0x8306e0);
  std::__cxx11::string::substr((ulong)&type_name,(ulong)&node_name);
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>_>
          ::find(&transform_types_abi_cxx11_._M_t,&type_name);
  if ((_Rb_tree_header *)cVar9._M_node ==
      &transform_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream((stringstream *)&err);
    std::operator<<(local_1c8,"unrecognized FBX transformation node");
    poVar14 = std::operator<<(local_1c8," of type ");
    poVar14 = std::operator<<(poVar14,(string *)&type_name);
    poVar14 = std::operator<<(poVar14," in node ");
    std::operator<<(poVar14,(string *)&node_name);
    pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    DeadlyImportError::DeadlyImportError(pDVar10,(string *)&node_attribute_uid);
    __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2c8._0_8_ = (pointer)0x0;
  local_2c8._8_4_ = 0.0;
  node_uid = 0;
  local_318 = 0.0;
  new_node_uid = 0;
  local_2d8 = 0.0;
  aiMatrix4x4t<float>::Decompose
            (&node_local->mTransformation,(aiVector3t<float> *)&new_node_uid,
             (aiVector3t<float> *)&node_uid,(aiVector3t<float> *)local_2c8);
  uVar2 = (undefined1)cVar9._M_node[3]._M_color;
  __args_1 = (aiVector3t<float> *)local_2c8;
  if (uVar2 == 0x74) {
LAB_0034afe4:
    std::
    vector<std::pair<std::__cxx11::string,aiVector3t<float>>,std::allocator<std::pair<std::__cxx11::string,aiVector3t<float>>>>
    ::emplace_back<std::__cxx11::string_const&,aiVector3t<float>&>
              ((vector<std::pair<std::__cxx11::string,aiVector3t<float>>,std::allocator<std::pair<std::__cxx11::string,aiVector3t<float>>>>
                *)transform_chain,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (cVar9._M_node + 1),__args_1);
  }
  else {
    if (uVar2 == 0x72) {
      node_uid = CONCAT44((float)((ulong)node_uid >> 0x20) * 57.29578,(float)node_uid * 57.29578);
      local_318 = local_318 * 57.29578;
      __args_1 = (aiVector3t<float> *)&node_uid;
      goto LAB_0034afe4;
    }
    __args_1 = (aiVector3t<float> *)&new_node_uid;
    if (uVar2 == 0x73) goto LAB_0034afe4;
    if (uVar2 != 0x69) {
      std::__cxx11::stringstream::stringstream((stringstream *)&err);
      std::operator<<(local_1c8,"unrecognized FBX transformation type code: ");
      std::operator<<(local_1c8,(char)cVar9._M_node[3]._M_color);
      pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      DeadlyImportError::DeadlyImportError(pDVar10,(string *)&node_attribute_uid);
      __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pSVar7 = local_310;
  for (uVar16 = 0; uVar16 < node_local->mNumChildren; uVar16 = uVar16 + 1) {
    WriteModelNodes(local_328,pSVar7,node_local->mChildren[uVar16],parent_uid_local,
                    (unordered_set<const_aiNode_*,_std::hash<const_aiNode_*>,_std::equal_to<const_aiNode_*>,_std::allocator<const_aiNode_*>_>
                     *)local_308,transform_chain);
  }
  std::__cxx11::string::~string((string *)&type_name);
LAB_0034b043:
  std::__cxx11::string::~string((string *)&node_name);
  return;
}

Assistant:

void FBXExporter::WriteModelNodes(
    StreamWriterLE& outstream,
    const aiNode* node,
    int64_t parent_uid,
    const std::unordered_set<const aiNode*>& limbnodes,
    std::vector<std::pair<std::string,aiVector3D>>& transform_chain
) {
    // first collapse any expanded transformation chains created by FBX import.
    std::string node_name(node->mName.C_Str());
    if (node_name.find(MAGIC_NODE_TAG) != std::string::npos) {
        auto pos = node_name.find(MAGIC_NODE_TAG) + MAGIC_NODE_TAG.size() + 1;
        std::string type_name = node_name.substr(pos);
        auto elem = transform_types.find(type_name);
        if (elem == transform_types.end()) {
            // then this is a bug and should be fixed
            std::stringstream err;
            err << "unrecognized FBX transformation node";
            err << " of type " << type_name << " in node " << node_name;
            throw DeadlyExportError(err.str());
        }
        aiVector3D t, r, s;
        node->mTransformation.Decompose(s, r, t);
        switch (elem->second.second) {
        case 'i': // inverse
            // we don't need to worry about the inverse matrices
            break;
        case 't': // translation
            transform_chain.emplace_back(elem->first, t);
            break;
        case 'r': // rotation
            r *= float(DEG);
            transform_chain.emplace_back(elem->first, r);
            break;
        case 's': // scale
            transform_chain.emplace_back(elem->first, s);
            break;
        default:
            // this should never happen
            std::stringstream err;
            err << "unrecognized FBX transformation type code: ";
            err << elem->second.second;
            throw DeadlyExportError(err.str());
        }
        // now continue on to any child nodes
        for (unsigned i = 0; i < node->mNumChildren; ++i) {
            WriteModelNodes(
                outstream,
                node->mChildren[i],
                parent_uid,
                limbnodes,
                transform_chain
            );
        }
        return;
    }

    int64_t node_uid = 0;
    // generate uid and connect to parent, if not the root node,
    if (node != mScene->mRootNode) {
        auto elem = node_uids.find(node);
        if (elem != node_uids.end()) {
            node_uid = elem->second;
        } else {
            node_uid = generate_uid();
            node_uids[node] = node_uid;
        }
        connections.emplace_back("C", "OO", node_uid, parent_uid);
    }

    // what type of node is this?
    if (node == mScene->mRootNode) {
        // handled later
    } else if (node->mNumMeshes == 1) {
        // connect to child mesh, which should have been written previously
        connections.emplace_back(
            "C", "OO", mesh_uids[node->mMeshes[0]], node_uid
        );
        // also connect to the material for the child mesh
        connections.emplace_back(
            "C", "OO",
            material_uids[mScene->mMeshes[node->mMeshes[0]]->mMaterialIndex],
            node_uid
        );
        // write model node
        WriteModelNode(
            outstream, binary, node, node_uid, "Mesh", transform_chain
        );
    } else if (limbnodes.count(node)) {
        WriteModelNode(
            outstream, binary, node, node_uid, "LimbNode", transform_chain
        );
        // we also need to write a nodeattribute to mark it as a skeleton
        int64_t node_attribute_uid = generate_uid();
        FBX::Node na("NodeAttribute");
        na.AddProperties(
            node_attribute_uid, FBX::SEPARATOR + "NodeAttribute", "LimbNode"
        );
        na.AddChild("TypeFlags", FBXExportProperty("Skeleton"));
        na.Dump(outstream, binary, 1);
        // and connect them
        connections.emplace_back("C", "OO", node_attribute_uid, node_uid);
    } else {
        // generate a null node so we can add children to it
        WriteModelNode(
            outstream, binary, node, node_uid, "Null", transform_chain
        );
    }

    // if more than one child mesh, make nodes for each mesh
    if (node->mNumMeshes > 1 || node == mScene->mRootNode) {
        for (size_t i = 0; i < node->mNumMeshes; ++i) {
            // make a new model node
            int64_t new_node_uid = generate_uid();
            // connect to parent node
            connections.emplace_back("C", "OO", new_node_uid, node_uid);
            // connect to child mesh, which should have been written previously
            connections.emplace_back(
                "C", "OO", mesh_uids[node->mMeshes[i]], new_node_uid
            );
            // also connect to the material for the child mesh
            connections.emplace_back(
                "C", "OO",
                material_uids[
                    mScene->mMeshes[node->mMeshes[i]]->mMaterialIndex
                ],
                new_node_uid
            );
            // write model node
            FBX::Node m("Model");
            // take name from mesh name, if it exists
            std::string name = mScene->mMeshes[node->mMeshes[i]]->mName.C_Str();
            name += FBX::SEPARATOR + "Model";
            m.AddProperties(new_node_uid, name, "Mesh");
            m.AddChild("Version", int32_t(232));
            FBX::Node p("Properties70");
            p.AddP70enum("InheritType", 1);
            m.AddChild(p);
            m.Dump(outstream, binary, 1);
        }
    }

    // now recurse into children
    for (size_t i = 0; i < node->mNumChildren; ++i) {
        WriteModelNodes(
            outstream, node->mChildren[i], node_uid, limbnodes
        );
    }
}